

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int ucstrncmp<((anonymous_namespace)::StringComparisonMode)1>(char16_t *a,char *b,size_t l)

{
  int iVar1;
  char16_t *e;
  char16_t *uc;
  uchar *c;
  size_t in_stack_00000050;
  uchar *in_stack_00000058;
  char16_t *in_stack_00000060;
  
  iVar1 = ucstrncmp_sse2<((anonymous_namespace)::StringComparisonMode)1,unsigned_char>
                    (in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return iVar1;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}